

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

bool __thiscall
IgnoreCaseStringLess::operator()(IgnoreCaseStringLess *this,string *a,string *b,locale *loc)

{
  bool bVar1;
  anon_class_8_1_a7c3953d_for__M_comp __comp;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last2;
  anon_class_8_1_a7c3953d_for__M_comp ignoreCaseCharLess;
  ctype<char> *ctype;
  locale *loc_local;
  string *b_local;
  string *a_local;
  IgnoreCaseStringLess *this_local;
  
  __comp.ctype = (ctype<char> *)std::use_facet<std::ctype<char>>(loc);
  __first1._M_current = (char *)std::__cxx11::string::begin();
  __last1._M_current = (char *)std::__cxx11::string::end();
  __first2._M_current = (char *)std::__cxx11::string::begin();
  __last2._M_current = (char *)std::__cxx11::string::end();
  bVar1 = std::operator()(__first1,__last1,__first2,__last2,__comp);
  return bVar1;
}

Assistant:

bool operator()(const std::string& a, const std::string& b, const std::locale& loc = std::locale()) const noexcept {
        const std::ctype<char>& ctype = std::use_facet<std::ctype<char>>(loc);
        const auto ignoreCaseCharLess = [&](char c1, char c2) { return ctype.tolower(c1) < ctype.tolower(c2); };
        return std::lexicographical_compare(a.begin(), a.end(), b.begin(), b.end(), ignoreCaseCharLess);
    }